

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::NextColumn(void)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float width;
  float offset_1;
  float offset_0;
  float local_24;
  ImGuiColumns *pIStack_20;
  float column_padding;
  ImGuiColumns *columns;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  g = (ImGuiContext *)GetCurrentWindow();
  if (((*(byte *)((long)(g->IO).KeyMap + 0x47) & 1) == 0) &&
     (*(ImGuiColumns **)((g->IO).KeysDown + 0xa4) != (ImGuiColumns *)0x0)) {
    columns = (ImGuiColumns *)GImGui;
    pIStack_20 = *(ImGuiColumns **)((g->IO).KeysDown + 0xa4);
    if (pIStack_20->Count == 1) {
      (((ImGuiWindowTempData *)&(g->IO).BackendPlatformName)->CursorPos).x =
           (float)(int)((g->IO).DisplaySize.x + ((ImVec1 *)((g->IO).KeysDown + 0x98))->x +
                       ((ImVec1 *)((g->IO).KeysDown + 0xa0))->x);
      if (pIStack_20->Current != 0) {
        __assert_fail("columns->Current == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                      ,0x1cd5,"void ImGui::NextColumn()");
      }
    }
    else {
      PopItemWidth();
      PopClipRect();
      local_24 = columns[0x39].HostWorkRect.Max.y;
      fVar2 = ImMax<float>(pIStack_20->LineMaxY,*(float *)((long)&(g->IO).BackendPlatformName + 4));
      pIStack_20->LineMaxY = fVar2;
      iVar1 = pIStack_20->Current + 1;
      pIStack_20->Current = iVar1;
      if (iVar1 < pIStack_20->Count) {
        fVar2 = GetColumnOffset(pIStack_20->Current);
        *(float *)((g->IO).KeysDown + 0xa0) =
             (fVar2 - *(float *)((g->IO).KeysDown + 0x98)) + local_24;
        ImDrawList::ChannelsSetCurrent
                  (*(ImDrawList **)((g->IO).KeysDown + 0x174),pIStack_20->Current + 1);
      }
      else {
        fVar2 = ImMax<float>(local_24 - (g->IO).MouseDragThreshold,0.0);
        *(float *)((g->IO).KeysDown + 0xa0) = fVar2;
        ImDrawList::ChannelsSetCurrent(*(ImDrawList **)((g->IO).KeysDown + 0x174),1);
        pIStack_20->Current = 0;
        pIStack_20->LineMinY = pIStack_20->LineMaxY;
      }
      *(float *)&(g->IO).BackendPlatformName =
           (float)(int)((g->IO).DisplaySize.x + *(float *)((g->IO).KeysDown + 0x98) +
                       *(float *)((g->IO).KeysDown + 0xa0));
      *(float *)((long)&(g->IO).BackendPlatformName + 4) = pIStack_20->LineMinY;
      ImVec2::ImVec2((ImVec2 *)&offset_1,0.0,0.0);
      (g->IO).BackendLanguageUserData = (void *)_offset_1;
      *(undefined4 *)&(g->IO).SetClipboardTextFn = 0;
      PushColumnClipRect(pIStack_20->Current);
      fVar2 = GetColumnOffset(pIStack_20->Current);
      fVar3 = GetColumnOffset(pIStack_20->Current + 1);
      PushItemWidth((fVar3 - fVar2) * 0.65);
      *(float *)((g->IO).KeysDown + 0xf4) = ((g->IO).DisplaySize.x + fVar3) - local_24;
    }
  }
  return;
}

Assistant:

void ImGui::NextColumn()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems || window->DC.CurrentColumns == NULL)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiColumns* columns = window->DC.CurrentColumns;

    if (columns->Count == 1)
    {
        window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
        IM_ASSERT(columns->Current == 0);
        return;
    }
    PopItemWidth();
    PopClipRect();

    const float column_padding = g.Style.ItemSpacing.x;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    if (++columns->Current < columns->Count)
    {
        // Columns 1+ ignore IndentX (by canceling it out)
        // FIXME-COLUMNS: Unnecessary, could be locked?
        window->DC.ColumnsOffset.x = GetColumnOffset(columns->Current) - window->DC.Indent.x + column_padding;
        window->DrawList->ChannelsSetCurrent(columns->Current + 1);
    }
    else
    {
        // New row/line
        // Column 0 honor IndentX
        window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
        window->DrawList->ChannelsSetCurrent(1);
        columns->Current = 0;
        columns->LineMinY = columns->LineMaxY;
    }
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = columns->LineMinY;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    PushColumnClipRect(columns->Current);     // FIXME-COLUMNS: Could it be an overwrite?

    // FIXME-COLUMNS: Share code with BeginColumns() - move code on columns setup.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}